

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O2

void set_v(ALLEGRO_VERTEX *vt,double x,double y,double u,double v)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  
  vt->x = (float)x;
  vt->y = (float)y;
  vt->z = 0.0;
  vt->u = (float)u;
  vt->v = (float)v;
  fVar2 = 1.0;
  fVar3 = 0.0;
  uVar1 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  (vt->color).r = (float)(int)uVar1;
  (vt->color).g = (float)(int)((ulong)uVar1 >> 0x20);
  (vt->color).b = fVar2;
  (vt->color).a = fVar3;
  return;
}

Assistant:

static void set_v(ALLEGRO_VERTEX *vt, double x, double y, double u, double v)
{
   vt->x = x;
   vt->y = y;
   vt->z = 0;
   vt->u = u;
   vt->v = v;
   vt->color = al_map_rgb_f(1, 1, 1);
}